

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XInclude.cpp
# Opt level: O2

bool __thiscall XIncludeErrorHandler::handleError(XIncludeErrorHandler *this,DOMError *domError)

{
  int iVar1;
  long *plVar2;
  XMLCh *pXVar3;
  ostream *poVar4;
  bool bVar5;
  StrX local_28;
  StrX local_20;
  
  iVar1 = (**(code **)(*(long *)domError + 0x10))(domError);
  if (iVar1 == 1) {
    std::operator<<((ostream *)&std::cerr,"\nWarning at file ");
  }
  else {
    iVar1 = (**(code **)(*(long *)domError + 0x10))(domError);
    if (iVar1 != 2) {
      std::operator<<((ostream *)&std::cerr,"\nFatal Error at file ");
      this->fSawErrors = true;
      bVar5 = false;
      goto LAB_00102a79;
    }
    std::operator<<((ostream *)&std::cerr,"\nError at file ");
    this->fSawErrors = true;
  }
  bVar5 = true;
LAB_00102a79:
  plVar2 = (long *)(**(code **)(*(long *)domError + 0x20))(domError);
  pXVar3 = (XMLCh *)(**(code **)(*plVar2 + 0x38))(plVar2);
  StrX::StrX(&local_20,pXVar3);
  std::operator<<((ostream *)&std::cerr,local_20.fLocalForm);
  poVar4 = std::operator<<((ostream *)&std::cerr,", line ");
  plVar2 = (long *)(**(code **)(*(long *)domError + 0x20))(domError);
  (**(code **)(*plVar2 + 0x10))(plVar2);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", char ");
  plVar2 = (long *)(**(code **)(*(long *)domError + 0x20))(domError);
  (**(code **)(*plVar2 + 0x18))(plVar2);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"\n  Message: ");
  pXVar3 = (XMLCh *)(**(code **)(*(long *)domError + 0x18))(domError);
  StrX::StrX(&local_28,pXVar3);
  std::operator<<(poVar4,local_28.fLocalForm);
  std::endl<char,std::char_traits<char>>(poVar4);
  StrX::~StrX(&local_28);
  StrX::~StrX(&local_20);
  return bVar5;
}

Assistant:

bool XIncludeErrorHandler::handleError(const DOMError& domError)
{
	bool continueParsing = true;
    if (domError.getSeverity() == DOMError::DOM_SEVERITY_WARNING)
        std::cerr << "\nWarning at file ";
    else if (domError.getSeverity() == DOMError::DOM_SEVERITY_ERROR)
    {
        std::cerr << "\nError at file ";
        fSawErrors = true;
    }
	else {
        std::cerr << "\nFatal Error at file ";
		continueParsing = false;
        fSawErrors = true;
	}

    std::cerr << StrX(domError.getLocation()->getURI())
         << ", line " << domError.getLocation()->getLineNumber()
         << ", char " << domError.getLocation()->getColumnNumber()
         << "\n  Message: " << StrX(domError.getMessage()) << std::endl;

    return continueParsing;
}